

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void mongone(monst *mdef)

{
  boolean bVar1;
  monst *mdef_local;
  
  mdef->mhp = 0;
  if (mdef == u.usteed) {
    dismount_steed(0);
  }
  bVar1 = does_block(mdef->dlevel,(int)mdef->mx,(int)mdef->my,mdef);
  if (bVar1 == '\0') {
    unblock_point((int)mdef->mx,(int)mdef->my);
  }
  mdrop_special_objs(mdef);
  discard_minvent(mdef);
  m_detach(mdef,mdef->data);
  return;
}

Assistant:

void mongone(struct monst *mdef)
{
	mdef->mhp = 0;	/* can skip some inventory bookkeeping */
	/* Player is thrown from his steed when it disappears */
	if (mdef == u.usteed)
		dismount_steed(DISMOUNT_GENERIC);

	/* monster should no longer block vision */
	/* careful, may be called for something other than the current level */
	if (!does_block(mdef->dlevel, mdef->mx, mdef->my, mdef))
	    unblock_point(mdef->mx, mdef->my);

	/* drop special items like the Amulet so that a dismissed Kop or nurse
	   can't remove them from the game */
	mdrop_special_objs(mdef);
	/* release rest of monster's inventory--it is removed from game */
	discard_minvent(mdef);
	m_detach(mdef, mdef->data);
}